

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O0

void __thiscall
Corrade::Containers::Optional<Corrade::Utility::JsonToken::Type>::Optional
          (Optional<Corrade::Utility::JsonToken::Type> *this,Type *value)

{
  Type *value_local;
  Optional<Corrade::Utility::JsonToken::Type> *this_local;
  
  this->_set = true;
  (this->field_0)._value = *value;
  return;
}

Assistant:

Optional(const T& value) noexcept(std::is_nothrow_copy_constructible<T>::value): _set{true} {
            /* Can't use {}, see the GCC 4.8-specific overload for details */
            #if defined(CORRADE_TARGET_GCC) && !defined(CORRADE_TARGET_CLANG) && __GNUC__ < 5
            Implementation::construct(_value, value);
            #else
            new(&_value) T{value};
            #endif
        }